

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLEntityDecl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLEntityDecl::XMLEntityDecl(XMLEntityDecl *this,MemoryManager *manager)

{
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XMLEntityDecl_004010c8;
  this->fId = 0;
  this->fValueLen = 0;
  this->fValue = (XMLCh *)0x0;
  this->fName = (XMLCh *)0x0;
  this->fNotationName = (XMLCh *)0x0;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fBaseURI = (XMLCh *)0x0;
  this->fIsExternal = false;
  this->fMemoryManager = manager;
  return;
}

Assistant:

XMLEntityDecl::XMLEntityDecl(MemoryManager* const manager) :

    fId(0)
    , fValueLen(0)
    , fValue(0)
    , fName(0)
    , fNotationName(0)
    , fPublicId(0)
    , fSystemId(0)
    , fBaseURI(0)
    , fIsExternal(false)
    , fMemoryManager(manager)
{
}